

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_felippa_rule.cpp
# Opt level: O1

void triangle_unit_o06b(double *w,double *xy)

{
  long lVar1;
  double *pdVar2;
  
  *w = 0.3;
  w[1] = 0.3;
  w[2] = 0.3;
  w[3] = 0.03333333333333333;
  w[4] = 0.03333333333333333;
  w[5] = 0.03333333333333333;
  pdVar2 = (double *)&DAT_0022f600;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *xy = *pdVar2;
    pdVar2 = pdVar2 + 1;
    xy = xy + 1;
  }
  return;
}

Assistant:

void triangle_unit_o06b ( double w[], double xy[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_UNIT_O06B returns a 6 point quadrature rule for the unit triangle.
//
//  Discussion:
//
//    This rule is precise for monomials through degree 3.
//
//    The integration region is:
//
//      0 <= X
//      0 <= Y
//      X + Y <= 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 April 2009
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Carlos Felippa,
//    A compendium of FEM integration formulas for symbolic work,
//    Engineering Computation,
//    Volume 21, Number 8, 2004, pages 867-890.
//
//  Parameters:
//
//    Output, double W[6], the weights.
//
//    Output, double XY[2*6], the abscissas.
//
{
  int order = 6;

  double w_save[6] = { 
    0.30000000000000000000, 
    0.30000000000000000000, 
    0.30000000000000000000, 
    0.033333333333333333333, 
    0.033333333333333333333, 
    0.033333333333333333333 };
  double xy_save[2*6] = { 
    0.66666666666666666667,  0.16666666666666666667, 
    0.16666666666666666667,  0.66666666666666666667, 
    0.16666666666666666667,  0.16666666666666666667, 
    0.0,  0.5, 
    0.5,  0.0, 
    0.5,  0.5 };

  r8vec_copy ( order, w_save, w );
  r8vec_copy ( 2*order, xy_save, xy );

  return;
}